

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void __thiscall ImFontAtlas::ClearFonts(ImFontAtlas *this)

{
  value_type *ppIVar1;
  ImVector<ImFont_*> *this_00;
  int i;
  int i_00;
  
  this_00 = &this->Fonts;
  for (i_00 = 0; i_00 < this_00->Size; i_00 = i_00 + 1) {
    ppIVar1 = ImVector<ImFont_*>::operator[](this_00,i_00);
    IM_DELETE<ImFont>(*ppIVar1);
  }
  ImVector<ImFont_*>::clear(this_00);
  return;
}

Assistant:

void    ImFontAtlas::ClearFonts()
{
    for (int i = 0; i < Fonts.Size; i++)
        IM_DELETE(Fonts[i]);
    Fonts.clear();
}